

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int cpool_add(JSParseState *s,JSValue val)

{
  long lVar1;
  int iVar2;
  undefined8 in_RCX;
  JSValueUnion JVar3;
  
  JVar3 = val.u;
  iVar2 = *(int *)((long)JVar3.ptr + 400);
  if (*(int *)((long)JVar3.ptr + 0x194) <= iVar2) {
    iVar2 = js_realloc_array((JSContext *)s,(void **)((long)JVar3.ptr + 0x188),0x10,
                             (int *)((long)JVar3.ptr + 0x194),iVar2 + 1);
    if (iVar2 != 0) {
      return -1;
    }
    iVar2 = *(int *)((long)JVar3.ptr + 400);
  }
  lVar1 = *(long *)((long)JVar3.ptr + 0x188);
  *(int *)((long)JVar3.ptr + 400) = iVar2 + 1;
  *(int64_t *)(lVar1 + (long)iVar2 * 0x10) = val.tag;
  *(undefined8 *)(lVar1 + 8 + (long)iVar2 * 0x10) = in_RCX;
  return *(int *)((long)JVar3.ptr + 400) + -1;
}

Assistant:

static int cpool_add(JSParseState *s, JSValue val)
{
    JSFunctionDef *fd = s->cur_func;
    
    if (js_resize_array(s->ctx, (void *)&fd->cpool, sizeof(fd->cpool[0]),
                        &fd->cpool_size, fd->cpool_count + 1))
        return -1;
    fd->cpool[fd->cpool_count++] = val;
    return fd->cpool_count - 1;
}